

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O2

int createCellConstraints
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *coverMatrix,int header)

{
  ulong __n;
  long lVar1;
  long lVar2;
  long lVar3;
  int row;
  long lVar4;
  long lVar5;
  reference rVar6;
  
  __n = (ulong)(uint)header;
  lVar2 = 0;
  for (lVar4 = 1; lVar4 != 10; lVar4 = lVar4 + 1) {
    __n = (ulong)(int)__n;
    lVar1 = lVar2;
    for (lVar5 = 1; lVar5 != 10; lVar5 = lVar5 + 1) {
      for (lVar3 = 0; lVar3 != 0x168; lVar3 = lVar3 + 0x28) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)
                           ((long)&(((coverMatrix->
                                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data + lVar3 + lVar1),__n);
        *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
      }
      __n = __n + 1;
      lVar1 = lVar1 + 0x168;
    }
    lVar2 = lVar2 + 0xca8;
  }
  return (int)__n;
}

Assistant:

int createCellConstraints(vector<vector<bool>> &coverMatrix, int header){
    for (int row = COVER_START_INDEX; row <= SIZE; row++) {
        for (int column = COVER_START_INDEX; column <= SIZE; column++, header++) {
            for (int n = COVER_START_INDEX; n <= SIZE; n++) {
                int index = indexInCoverMatrix(row, column, n);
                
            coverMatrix[index][header] = true;

            }
        }
    }
    return header;
}